

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O1

bool logIgnoredEvent(Type t)

{
  if (((0x36 < t - GraphicsSceneMouseMove) ||
      ((0x4003800003000fU >> ((ulong)(t - GraphicsSceneMouseMove) & 0x3f) & 1) == 0)) &&
     (3 < t - MouseButtonPress)) {
    if (6 < t - TabletMove) {
      return false;
    }
    if ((0x61U >> (t - TabletMove & 0x1f) & 1) == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool logIgnoredEvent(QEvent::Type t)
{
    bool result = false;
    switch (t) {
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
    case QEvent::MouseMove:
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchCancel:
    case QEvent::TouchEnd:
    case QEvent::TabletEnterProximity:
    case QEvent::TabletLeaveProximity:
    case QEvent::TabletMove:
    case QEvent::TabletPress:
    case QEvent::TabletRelease:
    case QEvent::GraphicsSceneMouseDoubleClick:
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseMove:
        result = true;
        break;
    default:
        break;

    }
    return result;
}